

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Endpoints.cpp
# Opt level: O3

bool soul::isMIDIEventEndpoint(EndpointDetails *details)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = false;
  if ((details->endpointType == event) && ((details->dataTypes).numActive == 1)) {
    bVar1 = isMIDIMessageStruct((details->dataTypes).items);
    if (bVar1) {
      iVar2 = std::__cxx11::string::compare((char *)&details->name);
      bVar1 = iVar2 != 0;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool isMIDIEventEndpoint (const EndpointDetails& details)
{
    return isEvent (details)
            && details.dataTypes.size() == 1
            && isMIDIMessageStruct (details.dataTypes.front())
            && ! isConsoleEndpoint (details.name);
}